

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void * getOutputFile(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  long in_RDX;
  undefined4 in_register_0000003c;
  ulong uVar2;
  undefined1 local_d0 [8];
  string outputFileName;
  path folder;
  ofstream *outFile;
  path outputFile;
  
  std::operator<<((ostream *)&std::cout,"Parsing  command line arguments....\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"out.cpp",
             (allocator<char> *)(outputFileName.field_2._M_local_buf + 8));
  if (1 < (int)argv) {
    std::operator<<((ostream *)&std::cout,"Arguments found...\n");
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (outputFileName.field_2._M_local_buf + 8);
    for (uVar2 = 1; ((ulong)argv & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__lhs,*(char **)(in_RDX + uVar2 * 8),(allocator<char> *)&outFile);
      bVar1 = std::operator==(__lhs,"-o");
      std::__cxx11::string::~string((string *)__lhs);
      if (bVar1) {
        std::__cxx11::string::assign(local_d0);
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"Finished parsing command line arguments.\n");
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            ((path *)&folder._M_cmpts,(char (*) [12])"glom_output",auto_format);
  std::filesystem::__cxx11::operator/
            ((path *)((long)&outputFileName.field_2 + 8),(path *)&outFile,(path *)&folder._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&folder._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&outFile);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&folder._M_cmpts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
             auto_format);
  std::filesystem::__cxx11::operator/
            ((path *)&outFile,(path *)((long)&outputFileName.field_2 + 8),(path *)&folder._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&folder._M_cmpts);
  bVar1 = std::filesystem::exists((path *)((long)&outputFileName.field_2 + 8));
  if (!bVar1) {
    std::filesystem::create_directory((path *)((long)&outputFileName.field_2 + 8));
  }
  bVar1 = std::filesystem::exists((path *)&outFile);
  if (bVar1) {
    std::filesystem::remove((path *)&outFile);
  }
  std::ofstream::ofstream((void *)CONCAT44(in_register_0000003c,argc),(char *)outFile,_S_out);
  std::filesystem::__cxx11::path::~path((path *)&outFile);
  std::filesystem::__cxx11::path::~path((path *)((long)&outputFileName.field_2 + 8));
  std::__cxx11::string::~string((string *)local_d0);
  return (void *)CONCAT44(in_register_0000003c,argc);
}

Assistant:

std::ofstream getOutputFile(int argc, char** argv)
{
    std::cout << "Parsing  command line arguments....\n";
    std::string outputFileName = "out.cpp";
    if (argc > 1) {
        std::cout << "Arguments found...\n";
        for (int i = 1; i < argc; i++) {
            if (std::string(argv[i]) == "-o") {
                if (argc >= i + 1) {
                    outputFileName = argv[i + 1];
                }
            }
        }
    }
    std::cout << "Finished parsing command line arguments.\n";
    const auto folder = fs::current_path() / "glom_output";
    const auto outputFile = folder / outputFileName;

    if (!fs::exists(folder))
        fs::create_directory(folder);

    if (fs::exists(outputFile)) {
        fs::remove(outputFile);
    }

    std::ofstream outFile(outputFile);
    return outFile;
}